

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.h
# Opt level: O0

void __thiscall
cppcms::url_dispatcher::assign<disp>
          (url_dispatcher *this,string *regex,member_type member,disp *object,int e1,int e2)

{
  disp *in_RCX;
  member_type in_RDX;
  binder2<disp> *in_RSI;
  undefined8 in_RDI;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *this_00;
  binder2<disp> local_78;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_60;
  undefined4 local_3c;
  
  local_3c = in_R9D;
  binder2<disp>::binder2(&local_78,in_RDX,in_RCX);
  this_00 = &local_60;
  std::function<void(std::__cxx11::string,std::__cxx11::string)>::
  function<cppcms::url_dispatcher::binder2<disp>,void>(this_00,in_RSI);
  cppcms::url_dispatcher::assign(in_RDI,in_RSI,this_00,local_3c,in_stack_00000008);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)0x14d99e);
  return;
}

Assistant:

void assign(std::string const &regex,void (C::*member)(std::string,std::string),C *object,int e1,int e2)
		{
			assign(regex,binder2<C>(member,object),e1,e2);
		}